

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O2

FFSTypeHandle_conflict FFSTypeHandle_by_index(FFSContext c,int index)

{
  size_t s;
  FMFormat_conflict *pp_Var1;
  FFSTypeHandle_conflict *pp_Var2;
  FMFormat_conflict p_Var3;
  FFSTypeHandle_conflict p_Var4;
  FMFormat_conflict p_Var5;
  FFSTypeHandle_conflict p_Var6;
  ulong uVar7;
  int j;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  
  lVar11 = (long)index;
  if (c->handle_list == (FFSTypeHandle_conflict *)0x0) {
    s = lVar11 * 8 + 8;
    pp_Var2 = (FFSTypeHandle_conflict *)ffs_malloc(s);
    c->handle_list = pp_Var2;
    memset(pp_Var2,0,s);
    c->handle_list_size = index + 1;
  }
  else if (c->handle_list_size <= index) {
    iVar12 = (int)(lVar11 + 1);
    pp_Var2 = (FFSTypeHandle_conflict *)ffs_realloc(c->handle_list,(long)iVar12 * 8);
    c->handle_list = pp_Var2;
    memset(pp_Var2 + c->handle_list_size,0,((lVar11 + 1) - (long)c->handle_list_size) * 8);
    c->handle_list_size = iVar12;
  }
  if (c->handle_list[lVar11] == (FFSTypeHandle_conflict)0x0) {
    p_Var3 = FMformat_by_index(c->fmc,index);
    if (p_Var3 == (FMFormat_conflict)0x0) {
      return (FFSTypeHandle_conflict)0x0;
    }
    p_Var4 = (FFSTypeHandle_conflict)ffs_malloc(0x48);
    c->handle_list[lVar11] = p_Var4;
    p_Var4 = c->handle_list[lVar11];
    p_Var4->context = c;
    p_Var4->format_id = index;
    p_Var4->conversion = (IOConversionPtr_conflict)0x0;
    p_Var4->status = not_checked;
    p_Var5 = FMformat_by_index(c->fmc,index);
    p_Var4->body = p_Var5;
    p_Var4->is_fixed_target = 0;
    pp_Var1 = p_Var3->subformats;
    if (((pp_Var1 == (FMFormat_conflict *)0x0) || (*pp_Var1 == (FMFormat_conflict)0x0)) &&
       (p_Var3->recursive == 0)) {
      p_Var4->subformats = (FFSTypeHandle_conflict *)0x0;
      p_Var4->field_subformats = (FFSTypeHandle_conflict *)0x0;
    }
    else {
      lVar9 = 1;
      uVar7 = 0;
      do {
        uVar13 = uVar7;
        lVar9 = lVar9 + -1;
        uVar7 = uVar13 + 8;
      } while (*(long *)((long)pp_Var1 + uVar13) != 0);
      pp_Var2 = (FFSTypeHandle_conflict *)ffs_malloc(uVar13 + 8 & 0x7fffffff8);
      p_Var4->subformats = pp_Var2;
      for (lVar10 = 0; -lVar10 != lVar9; lVar10 = lVar10 + 1) {
        p_Var6 = (FFSTypeHandle_conflict)ffs_malloc(0x48);
        p_Var4->subformats[lVar10] = p_Var6;
        pp_Var2 = p_Var4->subformats;
        pp_Var2[lVar10]->context = c;
        p_Var6 = pp_Var2[lVar10];
        p_Var6->format_id = -1;
        p_Var6->conversion = (IOConversionPtr_conflict)0x0;
        p_Var6 = pp_Var2[lVar10];
        p_Var6->status = not_checked;
        p_Var6->body = p_Var3->subformats[lVar10];
        pp_Var2[lVar10]->subformats = (FFSTypeHandle_conflict *)0x0;
      }
      *(undefined8 *)((long)p_Var4->subformats + uVar13) = 0;
      pp_Var2 = (FFSTypeHandle_conflict *)ffs_malloc((long)p_Var3->field_count << 3);
      p_Var4->field_subformats = pp_Var2;
      uVar13 = 0;
      memset(pp_Var2,0,(long)p_Var3->field_count << 3);
      uVar7 = (ulong)(uint)p_Var3->field_count;
      if (p_Var3->field_count < 1) {
        uVar7 = uVar13;
      }
      for (; uVar13 != uVar7; uVar13 = uVar13 + 1) {
        if (p_Var3->field_subformats[uVar13] == (FMFormat_conflict)0x0) {
          p_Var6 = (FFSTypeHandle_conflict)0x0;
LAB_0010d373:
          p_Var4->field_subformats[uVar13] = p_Var6;
        }
        else {
          for (lVar10 = 0; -lVar10 != lVar9; lVar10 = lVar10 + 1) {
            if (p_Var3->field_subformats[uVar13] == p_Var4->subformats[lVar10]->body) {
              p_Var4->field_subformats[uVar13] = p_Var4->subformats[lVar10];
            }
          }
          p_Var6 = p_Var4;
          if (p_Var3->field_subformats[uVar13] == p_Var3) goto LAB_0010d373;
        }
      }
      for (lVar10 = 0; -lVar10 != lVar9; lVar10 = lVar10 + 1) {
        p_Var6 = p_Var4->subformats[lVar10];
        p_Var5 = p_Var3->subformats[lVar10];
        pp_Var2 = (FFSTypeHandle_conflict *)ffs_malloc((long)p_Var5->field_count << 3);
        p_Var6->field_subformats = pp_Var2;
        memset(pp_Var2,0,(long)p_Var5->field_count << 3);
        uVar7 = (ulong)(uint)p_Var5->field_count;
        if (p_Var5->field_count < 1) {
          uVar7 = 0;
        }
        for (uVar13 = 0; uVar13 != uVar7; uVar13 = uVar13 + 1) {
          if (p_Var5->field_subformats[uVar13] != (FMFormat_conflict)0x0) {
            for (lVar8 = 0; -lVar8 != lVar9; lVar8 = lVar8 + 1) {
              if (p_Var5->field_subformats[uVar13] == p_Var4->subformats[lVar8]->body) {
                p_Var6->field_subformats[uVar13] = p_Var4->subformats[lVar8];
              }
            }
          }
        }
      }
    }
  }
  return c->handle_list[lVar11];
}

Assistant:

extern
FFSTypeHandle
FFSTypeHandle_by_index(FFSContext c, int index)
{
    FFSTypeHandle handle = NULL;
    if (c->handle_list == NULL) {
	c->handle_list = malloc(sizeof(c->handle_list[0]) * (index+1));
	memset(c->handle_list, 0, sizeof(c->handle_list[0]) * (index+1));
	c->handle_list_size = index + 1;
    } else if (c->handle_list_size <= index) {
	c->handle_list = realloc(c->handle_list,
				 (index+1)*sizeof(c->handle_list[0]));
	memset(&c->handle_list[c->handle_list_size], 0, 
	       sizeof(c->handle_list[0]) * ((index+1) - c->handle_list_size));
	c->handle_list_size = index + 1;
    }
    if (c->handle_list[index] == NULL) {
	FMFormat fmf = FMformat_by_index(c->fmc, index);
	if (fmf == NULL) return NULL;
	c->handle_list[index] = malloc(sizeof(struct _FFSTypeHandle));
	handle = c->handle_list[index];
	handle->context = c;
	handle->format_id = index;
	handle->conversion = NULL;
	handle->status = not_checked;
	handle->body = FMformat_by_index(c->fmc, index);
	handle->is_fixed_target = 0;
	if ((fmf->subformats && (fmf->subformats[0] != NULL)) || fmf->recursive) {
	    int i, k, subformat_count = 0;
	    while (fmf->subformats[subformat_count] != NULL) subformat_count++;
	    handle->subformats = 
		malloc(sizeof(FFSTypeHandle)*(subformat_count+1));
	    for (i = 0 ; i < subformat_count ; i++) {
		handle->subformats[i] = malloc(sizeof(*handle->subformats[i]));
		handle->subformats[i]->context = c;
		handle->subformats[i]->format_id = -1;
		handle->subformats[i]->conversion = NULL;
		handle->subformats[i]->status = not_checked;
		handle->subformats[i]->body = fmf->subformats[i];
		handle->subformats[i]->subformats = NULL;
	    }
	    handle->subformats[subformat_count] = NULL;
	    handle->field_subformats = 
		malloc(fmf->field_count * sizeof(FFSTypeHandle));
	    memset(handle->field_subformats, 0, 
		   fmf->field_count * sizeof(FFSTypeHandle));
	    for (i = 0; i < fmf->field_count; i++) {
		if (fmf->field_subformats[i] != NULL) {
		    int j;
		    for (j = 0; j < subformat_count; j++) {
			if (fmf->field_subformats[i] == handle->subformats[j]->body) {
			    handle->field_subformats[i] = handle->subformats[j];
			}
		    }
		    if (fmf->field_subformats[i] == fmf) {
			/* recursive */
			handle->field_subformats[i] = handle;
		    }
		} else {
		    handle->field_subformats[i] = NULL;
		}
	    }
	    for (k = 0; k < subformat_count ; k++) {
		FFSTypeHandle sf = handle->subformats[k];
		FMFormat sfmf = fmf->subformats[k];
		sf->field_subformats = 
		    malloc(sfmf->field_count * sizeof(FFSTypeHandle));
		memset(sf->field_subformats, 0, 
		       sfmf->field_count * sizeof(FFSTypeHandle));
		for (i = 0; i < sfmf->field_count; i++) {
		    if (sfmf->field_subformats[i] != NULL) {
			int j;
			for (j = 0; j < subformat_count; j++) {
			    if (sfmf->field_subformats[i] == handle->subformats[j]->body) {
				sf->field_subformats[i] = handle->subformats[j];
			    }
			}
		    }
		}
	    }
	} else {
	    handle->subformats = NULL;
	    handle->field_subformats = NULL;
	}
    }
    return c->handle_list[index];
}